

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O3

int blech32_addr_decode(int *witver,uint8_t *witdata,size_t *witdata_len,char *hrp,char *addr)

{
  char cVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  uint64_t uVar10;
  size_t sVar11;
  size_t sVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  char hrp_actual [1000];
  uint8_t data [1000];
  char local_808 [996];
  undefined1 auStack_424 [12];
  byte local_418;
  uint8_t local_417 [999];
  
  sVar5 = strlen(addr);
  if (0xfffffffffffffc1e < sVar5 - 0x3e9) {
    sVar11 = 0;
    pcVar6 = addr;
    do {
      pcVar6 = pcVar6 + -1;
      sVar12 = sVar11;
      if (pcVar6[sVar5] == '1') break;
      sVar11 = sVar11 + 1;
      sVar12 = sVar5;
    } while (sVar5 != sVar11);
    uVar7 = sVar5 - (sVar12 + 1);
    if (0xb < sVar12 && (sVar12 + 1 <= sVar5 && uVar7 != 0)) {
      lVar13 = uVar7 + (uVar7 == 0);
      uVar10 = 1;
      bVar3 = false;
      bVar4 = false;
      lVar15 = 0;
      do {
        cVar1 = addr[lVar15];
        uVar8 = (uint)cVar1;
        if (0x5d < (byte)(cVar1 - 0x21U)) goto LAB_00498d18;
        if ((byte)(cVar1 + 0x9fU) < 0x1a) {
          bVar4 = true;
        }
        else if ((byte)(cVar1 + 0xbfU) < 0x1a) {
          bVar3 = true;
          uVar8 = uVar8 | 0x20;
        }
        local_808[lVar15] = (char)uVar8;
        uVar10 = blech32_polymod_step(uVar10);
        uVar10 = uVar8 >> 5 ^ uVar10;
        lVar15 = lVar15 + 1;
      } while (lVar13 != lVar15);
      local_808[lVar13] = '\0';
      uVar10 = blech32_polymod_step(uVar10);
      lVar15 = 0;
      do {
        uVar10 = blech32_polymod_step(uVar10);
        uVar10 = (byte)addr[lVar15] & 0x1f ^ uVar10;
        lVar15 = lVar15 + 1;
      } while (lVar13 != lVar15);
      if (lVar13 + 1U < sVar5) {
        uVar14 = lVar13 + 0xd;
        do {
          cVar1 = addr[uVar14 - 0xc];
          if ((long)cVar1 < 0) {
            iVar9 = -1;
          }
          else {
            iVar9 = (int)blech32_charset_rev[cVar1];
          }
          if ((byte)(cVar1 + 0x9fU) < 0x1a) {
            bVar4 = true;
          }
          if ((byte)(cVar1 + 0xbfU) < 0x1a) {
            bVar3 = true;
          }
          if (iVar9 == -1) goto LAB_00498d18;
          uVar10 = blech32_polymod_step(uVar10);
          if (uVar14 < sVar5) {
            auStack_424[uVar14 + ~uVar7] = (char)iVar9;
          }
          uVar10 = uVar10 ^ (long)iVar9;
          lVar13 = (1 - sVar5) + uVar14;
          uVar14 = uVar14 + 1;
        } while (lVar13 != 0xc);
      }
      if ((((!bVar4) || (!bVar3)) && (0xfffffffffffffc1b < sVar12 - 0x3f1)) &&
         ((uVar10 == 1 && (iVar9 = strncmp(hrp,local_808,0x3e3), local_418 < 0x11 && iVar9 == 0))))
      {
        *witdata_len = 0;
        iVar9 = blech32_convert_bits(witdata,witdata_len,8,local_417,sVar12 - 0xd,5,0);
        if (((iVar9 != 0) && (sVar2 = *witdata_len, 0xffffffffffffffbf < sVar2 - 0x42)) &&
           (((local_418 != 0 || (sVar2 == 0x41)) || (sVar2 == 0x35)))) {
          *witver = (uint)local_418;
          return 1;
        }
      }
    }
  }
LAB_00498d18:
  wally_clear_2(&local_418,1000,local_808,1000);
  return 0;
}

Assistant:

static int blech32_addr_decode(int *witver, uint8_t *witdata, size_t *witdata_len, const char *hrp, const char *addr) {
    uint8_t data[WALLY_BLECH32_MAXLEN];
    char hrp_actual[WALLY_BLECH32_MAXLEN];
    size_t data_len;
    if (!blech32_decode(hrp_actual, data, &data_len, addr, WALLY_BLECH32_MAXLEN)) goto fail;
    if (data_len == 0 || data_len > (WALLY_BLECH32_MAXLEN - 4)) goto fail;
    if (strncmp(hrp, hrp_actual, WALLY_BLECH32_MAXLEN - 5) != 0) goto fail;
    if (data[0] > 16) goto fail;
    *witdata_len = 0;
    if (!blech32_convert_bits(witdata, witdata_len, 8, data + 1, data_len - 1, 5, 0)) goto fail;
    if (*witdata_len < 2 || *witdata_len > 65) goto fail;
    if (data[0] == 0 && *witdata_len != 53 && *witdata_len != 65) goto fail;
    *witver = data[0];
    return 1;
fail:
    wally_clear_2(data, sizeof(data), hrp_actual, sizeof(hrp_actual));
    return 0;
}